

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O2

int dopickup(void)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  trap *ptVar4;
  char *pcVar5;
  char *line;
  int tmpcount;
  
  ptVar4 = t_at(level,(int)u.ux,(int)u.uy);
  iVar3 = multi;
  multi = 0;
  if ((u._1052_1_ & 1) == 0) {
    bVar2 = is_pool(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      if (((((u.uprops[0x27].extrinsic != 0) &&
            (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) ||
           ((youmonst.data)->mlet == '\x05')) ||
          (uVar1 = (youmonst.data)->mflags1, (uVar1 & 0x10) != 0)) ||
         (((((uVar1 & 1) != 0 || (u.uprops[0x3c].extrinsic != 0)) ||
           ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 1) != 0)))) &&
          ((u.uprops[0x31].intrinsic == 0 && ((uVar1 & 0x400) == 0 && u.uprops[0x31].extrinsic == 0)
           ))))) {
        pcVar5 = "You cannot dive into the water to pick things up.";
        goto LAB_001a4dc5;
      }
      if ((u._1052_1_ & 2) == 0) {
        pcVar5 = "You can\'t even see the bottom, let alone pick up something.";
        goto LAB_001a4dc5;
      }
    }
    bVar2 = is_lava(level,(int)u.ux,(int)u.uy);
    if (bVar2 != '\0') {
      if (((((u.uprops[0x27].extrinsic != 0) &&
            (bVar2 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar2 == '\0')) ||
           ((youmonst.data)->mlet == '\x05')) ||
          (uVar1 = (youmonst.data)->mflags1, (uVar1 & 0x10) != 0)) ||
         (((((uVar1 & 1) != 0 || (u.uprops[0x3c].extrinsic != 0)) ||
           ((u.usteed != (monst *)0x0 && (((u.usteed)->data->mflags1 & 1) != 0)))) &&
          ((u.uprops[0x31].intrinsic == 0 && ((uVar1 & 0x400) == 0 && u.uprops[0x31].extrinsic == 0)
           ))))) {
        pcVar5 = "You can\'t reach the bottom to pick things up.";
        goto LAB_001a4dc5;
      }
      if (youmonst.data != mons + 0x157 && youmonst.data != mons + 0xa0) {
        pcVar5 = "You would burn to a crisp trying to pick things up.";
        goto LAB_001a4dc5;
      }
    }
    if (level->objects[u.ux][u.uy] == (obj *)0x0) {
      if (level->locations[u.ux][u.uy].typ == '\x1e') {
        pcVar5 = "The magic chest is firmly attached to the floor.";
      }
      else {
        pcVar5 = "There is nothing here to pick up.";
      }
    }
    else {
      bVar2 = can_reach_floor();
      if (bVar2 == '\0') {
        if ((u.usteed == (monst *)0x0) || ('\x01' < u.weapon_skills[0x27].skill)) {
          pcVar5 = surface((int)u.ux,(int)u.uy);
          line = "You cannot reach the %s.";
        }
        else {
          pcVar5 = y_monnam(u.usteed);
          line = "You aren\'t skilled enough to reach from %s.";
        }
        pline(line,pcVar5);
        return 0;
      }
      if ((((ptVar4 == (trap *)0x0) || ((ptVar4->field_0x8 & 0x20) == 0)) ||
          (1 < (byte)((ptVar4->field_0x8 & 0x1f) - 0xb))) || ((u.utrap != 0 && (u.utraptype == 1))))
      {
        iVar3 = pickup(-iVar3);
        return iVar3;
      }
      pcVar5 = "You cannot reach the bottom of the pit.";
    }
LAB_001a4dc5:
    pline(pcVar5);
    return 0;
  }
  if ((u.ustuck)->minvent != (obj *)0x0) {
    iVar3 = loot_mon(u.ustuck,&tmpcount,(boolean *)0x0);
    return iVar3;
  }
  if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
    pcVar5 = mon_nam(u.ustuck);
    pcVar5 = s_suffix(pcVar5);
    pline("You pick up %s tongue.",pcVar5);
    pline("But it\'s kind of slimy, so you drop it.");
    return 1;
  }
  if (u.uprops[0x1e].intrinsic == 0) {
    if ((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) {
      if (((youmonst.data)->mflags1 & 0x1000) == 0) {
        pcVar5 = "see";
        goto LAB_001a4e54;
      }
      goto LAB_001a4d9a;
    }
  }
  else {
LAB_001a4d9a:
    if (ublindf == (obj *)0x0) {
      pcVar5 = "feel";
      goto LAB_001a4e54;
    }
  }
  pcVar5 = "feel";
  if (ublindf->oartifact == '\x1d') {
    pcVar5 = "see";
  }
LAB_001a4e54:
  pline("You don\'t %s anything in here to pick up.",pcVar5);
  return 1;
}

Assistant:

int dopickup(void)
{
	int count;
	struct trap *traphere = t_at(level, u.ux, u.uy);
 	/* awful kludge to work around parse()'s pre-decrement */
	count = multi;
	multi = 0;	/* always reset */
	/* uswallow case added by GAN 01/29/87 */
	if (u.uswallow) {
	    if (!u.ustuck->minvent) {
		if (is_animal(u.ustuck->data)) {
		    pline("You pick up %s tongue.", s_suffix(mon_nam(u.ustuck)));
		    pline("But it's kind of slimy, so you drop it.");
		} else
		    pline("You don't %s anything in here to pick up.",
			  Blind ? "feel" : "see");
		return 1;
	    } else {
	    	int tmpcount = -count;
		return loot_mon(u.ustuck, &tmpcount, NULL);
	    }
	}
	if (is_pool(level, u.ux, u.uy)) {
	    if (Wwalking || is_floater(youmonst.data) || is_clinger(youmonst.data)
			|| (Flying && !Breathless)) {
		pline("You cannot dive into the water to pick things up.");
		return 0;
	    } else if (!Underwater) {
		pline("You can't even see the bottom, let alone pick up something.");
		return 0;
	    }
	}
	if (is_lava(level, u.ux, u.uy)) {
	    if (Wwalking || is_floater(youmonst.data) || is_clinger(youmonst.data)
			|| (Flying && !Breathless)) {
		pline("You can't reach the bottom to pick things up.");
		return 0;
	    } else if (!likes_lava(youmonst.data)) {
		pline("You would burn to a crisp trying to pick things up.");
		return 0;
	    }
	}
	if (!OBJ_AT(u.ux, u.uy)) {
	    if (IS_MAGIC_CHEST(level->locations[u.ux][u.uy].typ))
		pline("The magic chest is firmly attached to the floor.");
	    else
		pline("There is nothing here to pick up.");
	    return 0;
	}
	if (!can_reach_floor()) {
		if (u.usteed && P_SKILL(P_RIDING) < P_BASIC)
		    pline("You aren't skilled enough to reach from %s.",
			y_monnam(u.usteed));
		else
			pline("You cannot reach the %s.", surface(u.ux,u.uy));
		return 0;
	}

 	if (traphere && traphere->tseen) {
		/* Allow pickup from holes and trap doors that you escaped from
		 * because that stuff is teetering on the edge just like you, but
		 * not pits, because there is an elevation discrepancy with stuff
		 * in pits.
		 */
		if ((traphere->ttyp == PIT || traphere->ttyp == SPIKED_PIT) &&
		     (!u.utrap || (u.utrap && u.utraptype != TT_PIT))) {
			pline("You cannot reach the bottom of the pit.");
			return 0;
		}
	}

	return pickup(-count);
}